

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double bcorr(double *a0,double *b0)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar4 = *a0;
  dVar5 = *b0;
  uVar1 = (uint)(dVar4 < dVar5);
  auVar2._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar2._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar2._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar3._0_8_ = ~auVar2._0_8_ & (ulong)dVar5;
  auVar3._8_8_ = ~auVar2._8_8_ & (ulong)dVar4;
  auVar9._8_8_ = (ulong)dVar5 & auVar2._8_8_;
  auVar9._0_8_ = (ulong)dVar4 & auVar2._0_8_;
  auVar3 = auVar3 | auVar9;
  dVar4 = auVar3._0_8_ / auVar3._8_8_;
  dVar5 = dVar4 + 1.0;
  dVar12 = 1.0 / dVar5;
  dVar6 = dVar12 * dVar12;
  dVar10 = dVar12 + dVar6 + 1.0;
  dVar11 = dVar6 * dVar10 + dVar12 + 1.0;
  dVar13 = dVar6 * dVar11 + dVar12 + 1.0;
  dVar14 = dVar6 * dVar13 + dVar12 + 1.0;
  dVar15 = 1.0 / auVar3._8_8_;
  dVar15 = dVar15 * dVar15;
  dVar7 = 1.0 / auVar3._0_8_;
  dVar7 = dVar7 * dVar7;
  auVar8._0_8_ = ((((dVar7 * -0.00165322962780713 + 0.000837308034031215) * dVar7 +
                   -0.00059520293135187) * dVar7 + 0.00079365066682539) * dVar7 +
                 -0.00277777777760991) * dVar7 + 0.0833333333333333;
  auVar8._8_8_ = dVar4 / dVar5;
  auVar9 = divpd(auVar8,auVar3);
  return auVar9._8_8_ *
         ((((((dVar6 * dVar14 + dVar12 + 1.0) * -0.00165322962780713 * dVar15 +
             dVar14 * 0.000837308034031215) * dVar15 + dVar13 * -0.00059520293135187) * dVar15 +
           dVar11 * 0.00079365066682539) * dVar15 + dVar10 * -0.00277777777760991) * dVar15 +
         0.0833333333333333) + auVar9._0_8_;
}

Assistant:

double bcorr(double *a0,double *b0)
/*
-----------------------------------------------------------------------

     EVALUATION OF  DEL(A0) + DEL(B0) - DEL(A0 + B0)  WHERE
     LN(GAMMA(A)) = (A - 0.5)*LN(A) - A + 0.5*LN(2*PI) + DEL(A).
     IT IS ASSUMED THAT A0 .GE. 8 AND B0 .GE. 8.

-----------------------------------------------------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double bcorr,a,b,c,h,s11,s3,s5,s7,s9,t,w,x,x2;
/*
     ..
     .. Executable Statements ..
*/
    a = fifdmin1(*a0,*b0);
    b = fifdmax1(*a0,*b0);
    h = a/b;
    c = h/(1.0e0+h);
    x = 1.0e0/(1.0e0+h);
    x2 = x*x;
/*
                SET SN = (1 - X**N)/(1 - X)
*/
    s3 = 1.0e0+(x+x2);
    s5 = 1.0e0+(x+x2*s3);
    s7 = 1.0e0+(x+x2*s5);
    s9 = 1.0e0+(x+x2*s7);
    s11 = 1.0e0+(x+x2*s9);
/*
                SET W = DEL(B) - DEL(A + B)
*/
    t = pow(1.0e0/b,2.0);
    w = ((((c5*s11*t+c4*s9)*t+c3*s7)*t+c2*s5)*t+c1*s3)*t+c0;
    w *= (c/b);
/*
                   COMPUTE  DEL(A) + W
*/
    t = pow(1.0e0/a,2.0);
    bcorr = (((((c5*t+c4)*t+c3)*t+c2)*t+c1)*t+c0)/a+w;
    return bcorr;
}